

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O1

REF_STATUS ref_smooth_tri_weighted_ideal_uv(REF_GRID ref_grid,REF_INT node,REF_DBL *ideal_uv)

{
  REF_ADJ pRVar1;
  REF_NODE pRVar2;
  REF_GEOM ref_geom;
  REF_ADJ_ITEM pRVar3;
  REF_DBL RVar4;
  undefined8 uVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  REF_INT RVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  REF_INT id;
  REF_DBL uv [2];
  REF_DBL quality;
  REF_DBL q1;
  REF_DBL q2;
  REF_DBL q;
  REF_INT geom;
  REF_DBL uv_orig [2];
  REF_DBL tri_uv [2];
  REF_DBL min_uv_area;
  REF_DBL q0;
  REF_DBL dq_dxyz [3];
  REF_INT nodes_1 [27];
  REF_DBL dxyz_duv [15];
  REF_DBL xyz [3];
  REF_INT nodes [27];
  REF_INT local_2d4;
  REF_GEOM local_2d0;
  double local_2c8;
  ulong local_2c0;
  REF_DBL local_2b8;
  undefined8 uStack_2b0;
  double local_2a8;
  double local_2a0;
  double local_290;
  double local_288;
  double local_280;
  double local_278;
  double local_270;
  REF_NODE local_268;
  double local_260;
  double local_258;
  uint local_24c;
  REF_INT local_248;
  REF_INT local_244;
  double local_240;
  double local_238;
  double local_230;
  REF_DBL local_228;
  undefined8 uStack_220;
  double local_218 [4];
  ulong local_1f8;
  double local_1f0;
  double local_1e8;
  double local_1e0;
  double local_1d8;
  double local_1d0;
  double local_1c8;
  int local_1b8;
  int local_1b4;
  int local_1b0;
  double local_148;
  double local_140;
  double local_138;
  double local_130;
  double local_128;
  double local_120;
  REF_DBL local_c8 [4];
  REF_INT local_a8 [30];
  
  *ideal_uv = 0.0;
  ideal_uv[1] = 0.0;
  uVar6 = ref_smooth_tri_quality_around(ref_grid,node,&local_288);
  if (uVar6 == 0) {
    if (local_288 < 0.0) {
      local_270 = sqrt(local_288);
    }
    else {
      local_270 = SQRT(local_288);
    }
    uVar9 = 0xffffffff;
    if (-1 < node) {
      pRVar1 = ref_grid->cell[3]->ref_adj;
      uVar9 = 0xffffffff;
      if (node < pRVar1->nnode) {
        uVar9 = (ulong)(uint)pRVar1->first[(uint)node];
      }
    }
    if ((int)uVar9 == -1) {
      dVar18 = 0.0;
    }
    else {
      dVar18 = 0.0;
      local_2c0 = (ulong)uVar6;
      RVar10 = ref_grid->cell[3]->ref_adj->item[(int)uVar9].ref;
      do {
        local_248 = RVar10;
        pRVar2 = ref_grid->node;
        ref_geom = ref_grid->geom;
        local_218[0] = 0.0;
        local_218[1] = 0.0;
        local_1f8 = uVar9;
        local_1f0 = dVar18;
        uVar6 = ref_cell_nodes(ref_grid->cell[3],local_248,&local_1b8);
        if (uVar6 == 0) {
          iVar11 = -1;
          if (local_1b8 == node) {
            iVar11 = local_1b0;
          }
          iVar8 = -1;
          if (local_1b8 == node) {
            iVar8 = local_1b4;
          }
          if (local_1b4 == node) {
            iVar8 = local_1b0;
            iVar11 = local_1b8;
          }
          if (local_1b0 == node) {
            iVar8 = local_1b8;
            iVar11 = local_1b4;
          }
          local_2d0 = ref_geom;
          local_268 = pRVar2;
          if ((iVar8 == -1) || (iVar11 == -1)) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                   ,0x1a3,"ref_smooth_tri_ideal_uv","empty triangle side");
            uVar6 = 1;
            uVar13 = local_2c0;
          }
          else {
            local_1b8 = node;
            local_1b4 = iVar8;
            local_1b0 = iVar11;
            uVar6 = ref_geom_unique_id(ref_geom,node,2,&local_2d4);
            uVar13 = local_2c0;
            if (uVar6 == 0) {
              uVar6 = ref_geom_tuv(local_2d0,node,2,local_2d4,&local_228);
              if (uVar6 == 0) {
                uVar6 = ref_geom_find(local_2d0,node,2,local_2d4,&local_244);
                if (uVar6 == 0) {
                  local_218[0] = local_228;
                  local_218[1] = (double)uStack_220;
                  uVar6 = ref_node_tri_quality(local_268,&local_1b8,&local_1e0);
                  if (uVar6 == 0) {
                    local_2b8 = local_228;
                    uStack_2b0 = uStack_220;
                    local_258 = local_1e0;
                    RVar4 = local_228;
                    uVar5 = uStack_220;
                    if (local_1e0 < local_270) {
                      local_238 = local_2a8;
                      local_240 = local_2a0;
                      uVar12 = 0;
                      local_290 = 0.0;
                      local_2c8 = 0.0;
                      do {
                        uVar6 = ref_geom_add(local_2d0,node,2,local_2d4,&local_2b8);
                        if (uVar6 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                 ,0x1b7,"ref_smooth_tri_ideal_uv",(ulong)uVar6,"set uv");
                          goto LAB_001df3f7;
                        }
                        uVar6 = ref_smooth_tri_uv_area_around(ref_grid,node,&local_1e8);
                        if (uVar6 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                 ,0x1b9,"ref_smooth_tri_ideal_uv",(ulong)uVar6,"min area");
                          goto LAB_001df3f7;
                        }
                        RVar4 = local_228;
                        uVar5 = uStack_220;
                        if (local_1e8 <= local_268->min_uv_area) break;
                        uVar6 = ref_geom_constrain(ref_grid,node);
                        if (uVar6 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                 ,0x1c0,"ref_smooth_tri_ideal_uv",(ulong)uVar6,"constrain");
                          goto LAB_001df3f7;
                        }
                        uVar6 = ref_node_tri_dquality_dnode0
                                          (local_268,&local_1b8,&local_258,&local_1d8);
                        if (uVar6 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                 ,0x1c1,"ref_smooth_tri_ideal_uv",(ulong)uVar6,"qual");
                          goto LAB_001df3f7;
                        }
                        uVar6 = ref_egads_eval(local_2d0,local_244,local_c8,&local_148);
                        if (uVar6 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                 ,0x1c2,"ref_smooth_tri_ideal_uv",(ulong)uVar6,"eval face");
                          goto LAB_001df3f7;
                        }
                        local_218[3] = local_138 * local_1c8 +
                                       local_148 * local_1d8 + local_140 * local_1d0;
                        local_218[2] = local_1c8 * local_120 +
                                       local_1d8 * local_130 + local_1d0 * local_128;
                        local_2a0 = local_218[2];
                        local_2a8 = local_218[3];
                        if (uVar12 != 0) {
                          dVar18 = (local_218[3] - local_2c8) * local_218[3] +
                                   (local_218[2] - local_290) * local_218[2];
                          dVar19 = local_2c8 * local_2c8 + local_290 * local_290;
                          dVar16 = dVar19 * 1e+20;
                          if (dVar16 <= -dVar16) {
                            dVar16 = -dVar16;
                          }
                          dVar17 = dVar18;
                          if (dVar18 <= -dVar18) {
                            dVar17 = -dVar18;
                          }
                          dVar18 = (double)(-(ulong)(dVar17 < dVar16) & (ulong)(dVar18 / dVar19));
                          uVar14 = 0;
                          uVar15 = 0;
                          if (0.0 <= dVar18) {
                            uVar14 = SUB84(dVar18,0);
                            uVar15 = (undefined4)((ulong)dVar18 >> 0x20);
                          }
                          local_2a0 = (double)CONCAT44(uVar15,uVar14) * local_240 + local_218[2];
                          local_2a8 = local_238 * (double)CONCAT44(uVar15,uVar14) + local_218[3];
                        }
                        dVar18 = local_2a8 * local_2a8 + local_2a0 * local_2a0;
                        local_240 = local_2a0;
                        local_238 = local_2a8;
                        if (dVar18 < 0.0) {
                          dVar18 = sqrt(dVar18);
                        }
                        else {
                          dVar18 = SQRT(dVar18);
                        }
                        local_278 = (1.0 - local_258) / dVar18;
                        local_2c8 = (local_278 + 0.0) * 0.5;
                        uVar6 = ref_smooth_tri_quality
                                          (ref_grid,node,local_2d4,&local_1b8,&local_2b8,&local_2a8,
                                           0.0,&local_280);
                        if (uVar6 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                 ,0x1e3,"ref_smooth_tri_ideal_uv",(ulong)uVar6,"set uv for q1");
                          goto LAB_001df3f7;
                        }
                        uVar6 = ref_smooth_tri_quality
                                          (ref_grid,node,local_2d4,&local_1b8,&local_2b8,&local_2a8,
                                           local_2c8,&local_260);
                        if (uVar6 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                 ,0x1e6,"ref_smooth_tri_ideal_uv",(ulong)uVar6,"set uv for q2");
                          goto LAB_001df3f7;
                        }
                        uVar6 = ref_smooth_tri_quality
                                          (ref_grid,node,local_2d4,&local_1b8,&local_2b8,&local_2a8,
                                           local_278,&local_230);
                        if (uVar6 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                 ,0x1e9,"ref_smooth_tri_ideal_uv",(ulong)uVar6,"set uv for q3");
                          goto LAB_001df3f7;
                        }
                        uVar14 = 0;
                        uVar15 = 0;
                        iVar11 = 0xf;
                        local_24c = uVar12;
                        do {
                          if (local_280 <= local_230) {
                            local_280 = local_260;
                            uVar14 = SUB84(local_2c8,0);
                            uVar15 = (undefined4)((ulong)local_2c8 >> 0x20);
                          }
                          else {
                            local_230 = local_260;
                            local_278 = local_2c8;
                          }
                          local_290 = (double)CONCAT44(uVar15,uVar14);
                          local_2c8 = (local_278 + (double)CONCAT44(uVar15,uVar14)) * 0.5;
                          uVar6 = ref_smooth_tri_quality
                                            (ref_grid,node,local_2d4,&local_1b8,&local_2b8,
                                             &local_2a8,local_2c8,&local_260);
                          if (uVar6 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                   ,0x1f5,"ref_smooth_tri_ideal_uv",(ulong)uVar6,"set uv for q2");
                            goto LAB_001df3f7;
                          }
                          iVar11 = iVar11 + -1;
                          uVar14 = SUB84(local_290,0);
                          uVar15 = (undefined4)((ulong)local_290 >> 0x20);
                        } while (iVar11 != 0);
                        if (local_260 < local_280) {
                          uVar6 = ref_smooth_tri_quality
                                            (ref_grid,node,local_2d4,&local_1b8,&local_2b8,
                                             &local_2a8,local_290,&local_280);
                          if (uVar6 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                   ,0x1fa,"ref_smooth_tri_ideal_uv",(ulong)uVar6,"set uv for q1");
                            uVar13 = local_2c0;
                            goto LAB_001df3f7;
                          }
                          uVar6 = ref_geom_tuv(local_2d0,node,2,local_2d4,&local_2b8);
                          uVar13 = local_2c0;
                          RVar4 = local_2b8;
                          uVar5 = uStack_2b0;
                          if (uVar6 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                   ,0x1fb,"ref_smooth_tri_ideal_uv",(ulong)uVar6,"uv");
                            uVar13 = local_2c0;
                            goto LAB_001df3f7;
                          }
                          break;
                        }
                        uVar6 = ref_geom_tuv(local_2d0,node,2,local_2d4,&local_2b8);
                        if (uVar6 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                 ,0x1fe,"ref_smooth_tri_ideal_uv",(ulong)uVar6,"uv");
                          goto LAB_001df3f7;
                        }
                        RVar4 = local_2b8;
                        uVar5 = uStack_2b0;
                        if (0x1c < local_24c) break;
                        uVar12 = local_24c + 1;
                        local_290 = local_218[2];
                        local_2c8 = local_218[3];
                      } while (local_258 < local_270);
                    }
                    uStack_2b0 = uVar5;
                    local_2b8 = RVar4;
                    uVar6 = ref_geom_add(local_2d0,node,2,local_2d4,&local_228);
                    if (uVar6 == 0) {
                      uVar6 = ref_geom_constrain(ref_grid,node);
                      if (uVar6 == 0) {
                        local_218[0] = local_2b8;
                        local_218[1] = (double)uStack_2b0;
                        uVar6 = 0;
                      }
                      else {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                               ,0x20d,"ref_smooth_tri_ideal_uv",(ulong)uVar6,"constrain");
                      }
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                             ,0x20c,"ref_smooth_tri_ideal_uv",(ulong)uVar6,"set uv");
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                           ,0x1af,"ref_smooth_tri_ideal_uv",(ulong)uVar6,"qual");
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                         ,0x1ab,"ref_smooth_tri_ideal_uv",(ulong)uVar6,"geom");
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                       ,0x1aa,"ref_smooth_tri_ideal_uv",(ulong)uVar6,"uv");
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                     ,0x1a9,"ref_smooth_tri_ideal_uv",(ulong)uVar6,"id");
              uVar13 = local_2c0;
            }
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
                 0x193,"ref_smooth_tri_ideal_uv",(ulong)uVar6,"get tri");
          uVar13 = local_2c0;
        }
LAB_001df3f7:
        if (uVar6 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
                 0x299,"ref_smooth_tri_weighted_ideal_uv",(ulong)uVar6,"tri ideal");
          return uVar6;
        }
        uVar6 = ref_cell_nodes(ref_grid->cell[3],local_248,local_a8);
        if (uVar6 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
                 0x29a,"ref_smooth_tri_weighted_ideal_uv",(ulong)uVar6,"nodes");
          return uVar6;
        }
        uVar6 = ref_node_tri_quality(ref_grid->node,local_a8,&local_288);
        if (uVar6 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
                 0x29c,"ref_smooth_tri_weighted_ideal_uv",(ulong)uVar6,"tri qual");
          return uVar6;
        }
        dVar18 = ref_grid->adapt->smooth_min_quality;
        if (local_288 <= dVar18) {
          local_288 = dVar18;
        }
        lVar7 = 0;
        do {
          ideal_uv[lVar7] = local_218[lVar7] * (1.0 / local_288) + ideal_uv[lVar7];
          lVar7 = lVar7 + 1;
        } while (lVar7 == 1);
        pRVar3 = ref_grid->cell[3]->ref_adj->item;
        iVar11 = pRVar3[(int)local_1f8].next;
        uVar9 = (ulong)iVar11;
        if (uVar9 == 0xffffffffffffffff) {
          RVar10 = -1;
        }
        else {
          RVar10 = pRVar3[uVar9].ref;
        }
        dVar18 = local_1f0 + 1.0 / local_288;
        local_2c0 = uVar13;
      } while (iVar11 != -1);
    }
    dVar16 = dVar18 * 1e+20;
    if (dVar16 <= -dVar16) {
      dVar16 = -dVar16;
    }
    if (dVar16 <= 1.0) {
      printf("normalization = %e\n");
      uVar6 = 4;
    }
    else {
      uVar6 = 0;
      lVar7 = 0;
      do {
        ideal_uv[lVar7] = ideal_uv[lVar7] * (1.0 / dVar18);
        lVar7 = lVar7 + 1;
      } while (lVar7 == 1);
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",0x294,
           "ref_smooth_tri_weighted_ideal_uv",(ulong)uVar6,"q");
  }
  return uVar6;
}

Assistant:

REF_FCN static REF_STATUS ref_smooth_tri_weighted_ideal_uv(REF_GRID ref_grid,
                                                           REF_INT node,
                                                           REF_DBL *ideal_uv) {
  REF_INT item, cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT iuv;
  REF_DBL tri_uv[2];
  REF_DBL target_q, quality, weight, normalization;

  normalization = 0.0;
  for (iuv = 0; iuv < 2; iuv++) ideal_uv[iuv] = 0.0;

  RSS(ref_smooth_tri_quality_around(ref_grid, node, &quality), "q");
  target_q = sqrt(quality);

  each_ref_cell_having_node(ref_grid_tri(ref_grid), node, item, cell) {
    RSS(ref_smooth_tri_ideal_uv(ref_grid, node, cell, tri_uv, target_q),
        "tri ideal");
    RSS(ref_cell_nodes(ref_grid_tri(ref_grid), cell, nodes), "nodes");
    RSS(ref_node_tri_quality(ref_grid_node(ref_grid), nodes, &quality),
        "tri qual");
    quality = MAX(quality, ref_grid_adapt(ref_grid, smooth_min_quality));
    weight = 1.0 / quality;
    normalization += weight;
    for (iuv = 0; iuv < 2; iuv++) ideal_uv[iuv] += weight * tri_uv[iuv];
  }

  if (ref_math_divisible(1.0, normalization)) {
    for (iuv = 0; iuv < 2; iuv++)
      ideal_uv[iuv] = (1.0 / normalization) * ideal_uv[iuv];
  } else {
    printf("normalization = %e\n", normalization);
    return REF_DIV_ZERO;
  }

  return REF_SUCCESS;
}